

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  uint32_t f_1;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t u;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint32_t q;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint32_t r;
  uint uVar15;
  uint32_t v;
  uint uVar16;
  uint32_t c1;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_trans2x2 local_f8;
  secp256k1_modinv32_signed30 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int32_t local_b8;
  uint uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  int32_t local_88;
  secp256k1_modinv32_signed30 local_78;
  secp256k1_modinv32_signed30 local_54;
  
  local_78.v[4] = 0;
  local_78.v[5] = 0;
  local_78.v[6] = 0;
  local_78.v[7] = 0;
  local_78.v[0] = 0;
  local_78.v[1] = 0;
  local_78.v[2] = 0;
  local_78.v[3] = 0;
  local_78.v[8] = 0;
  local_54.v[5] = 0;
  local_54.v[6] = 0;
  local_54.v[7] = 0;
  local_54.v[8] = 0;
  local_54.v[1] = 0;
  local_54.v[2] = 0;
  local_54.v[3] = 0;
  local_54.v[4] = 0;
  local_54.v[0] = 1;
  local_88 = (modinfo->modulus).v[8];
  local_a8 = *(undefined8 *)(modinfo->modulus).v;
  uStack_a0 = *(undefined8 *)((modinfo->modulus).v + 2);
  local_98 = *(undefined8 *)((modinfo->modulus).v + 4);
  uStack_90 = *(undefined8 *)((modinfo->modulus).v + 6);
  local_b8 = x->v[8];
  local_d8 = *(undefined8 *)x->v;
  uStack_d0 = *(undefined8 *)(x->v + 2);
  local_c8 = *(undefined8 *)(x->v + 4);
  uStack_c0 = *(undefined8 *)(x->v + 6);
  iVar1 = 0;
  uVar6 = 0xffffffff;
  local_e8 = x;
  do {
    local_e0 = (long)(int)(uint)local_a8;
    lVar13 = (long)(int)(uint)local_d8;
    uVar7 = 1;
    iVar3 = 0x1e;
    uVar16 = 0;
    uVar12 = 0;
    uVar15 = 1;
    uVar2 = (uint)local_a8;
    uVar5 = (uint)local_d8;
    do {
      uVar4 = (int)uVar6 >> 0x1f;
      uVar8 = -(uVar5 & 1);
      uVar5 = ((uVar4 ^ uVar2) - uVar4 & uVar8) + uVar5;
      uVar12 = uVar12 + ((uVar4 ^ uVar7) - uVar4 & uVar8);
      uVar15 = uVar15 + ((uVar4 ^ uVar16) - uVar4 & uVar8);
      uVar8 = uVar8 & uVar4;
      uVar6 = (uVar6 ^ uVar8) - 1;
      uVar2 = uVar2 + (uVar5 & uVar8);
      uVar5 = uVar5 >> 1;
      uVar7 = (uVar7 + (uVar12 & uVar8)) * 2;
      uVar16 = (uVar16 + (uVar8 & uVar15)) * 2;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    local_f8.u = uVar7;
    local_f8.v = uVar16;
    local_f8.q = uVar12;
    local_f8.r = uVar15;
    secp256k1_modinv32_update_de_30(&local_78,&local_54,&local_f8,modinfo);
    lVar14 = lVar13 * (int)uVar15 + local_e0 * (int)uVar12 >> 0x1e;
    lVar13 = (int)uVar16 * lVar13 + (int)uVar7 * local_e0 >> 0x1e;
    lVar9 = 1;
    do {
      lVar10 = (long)*(int *)((long)&local_a8 + lVar9 * 4);
      lVar11 = (long)*(int *)((long)&local_d8 + lVar9 * 4);
      lVar13 = lVar11 * (int)uVar16 + lVar10 * (int)uVar7 + lVar13;
      lVar14 = lVar11 * (int)uVar15 + lVar10 * (int)uVar12 + lVar14;
      (&uStack_ac)[lVar9] = (uint)lVar13 & 0x3fffffff;
      *(uint *)((long)&local_e0 + lVar9 * 4 + 4) = (uint)lVar14 & 0x3fffffff;
      lVar9 = lVar9 + 1;
      lVar14 = lVar14 >> 0x1e;
      lVar13 = lVar13 >> 0x1e;
    } while (lVar9 != 9);
    local_88 = (int32_t)lVar13;
    local_b8 = (int32_t)lVar14;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x14);
  secp256k1_modinv32_normalize_30(&local_78,local_88,modinfo);
  local_e8->v[8] = local_78.v[8];
  *(undefined8 *)(local_e8->v + 4) = local_78.v._16_8_;
  *(undefined8 *)(local_e8->v + 6) = local_78.v._24_8_;
  *(undefined8 *)local_e8->v = local_78.v._0_8_;
  *(undefined8 *)(local_e8->v + 2) = local_78.v._8_8_;
  return;
}

Assistant:

static void secp256k1_modinv32(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv32_signed30 d = {{0}};
    secp256k1_modinv32_signed30 e = {{1}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int i;
    int32_t zeta = -1; /* zeta = -(delta+1/2); delta is initially 1/2. */

    /* Do 20 iterations of 30 divsteps each = 600 divsteps. 590 suffices for 256-bit inputs. */
    for (i = 0; i < 20; ++i) {
        /* Compute transition matrix and new zeta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        zeta = secp256k1_modinv32_divsteps_30(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[8], modinfo);
    *x = d;
}